

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryVaryingGeometryShaderTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::geometry::anon_unknown_1::VaryingTest::createInstance(VaryingTest *this,Context *context)

{
  TestInstance *this_00;
  char *name;
  Context *context_local;
  VaryingTest *this_local;
  
  this_00 = (TestInstance *)operator_new(0x70);
  name = tcu::TestNode::getName((TestNode *)this);
  GeometryVaryingTestInstance::GeometryVaryingTestInstance
            ((GeometryVaryingTestInstance *)this_00,context,name);
  return this_00;
}

Assistant:

TestInstance* VaryingTest::createInstance (Context& context) const
{
	return new GeometryVaryingTestInstance(context, getName());
}